

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

int SaveHobeta(path *fname,char *fhobname,aint start,aint length)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  FILE *__s;
  long lVar7;
  uint uVar8;
  byte local_68 [15];
  undefined2 local_59;
  string local_48;
  
  iVar3 = -1;
  if (length + start < 0x10001) {
    iVar3 = length;
  }
  iVar1 = 0x10000 - start;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  local_68[0] = 0x20;
  local_68[1] = 0x20;
  local_68[2] = 0x20;
  local_68[3] = 0x20;
  local_68[4] = 0x20;
  local_68[5] = 0x20;
  local_68[6] = 0x20;
  local_68[7] = 0x20;
  local_68[8] = ' ';
  sVar5 = strlen(fhobname);
  iVar3 = (int)sVar5;
  if (((1 < iVar3) && (pcVar6 = strrchr(fhobname,0x2e), pcVar6 != (char *)0x0)) &&
     (pcVar6[1] != '\0')) {
    iVar3 = (int)pcVar6 - (int)fhobname;
    local_68[8] = pcVar6[1];
  }
  iVar4 = 8;
  if (iVar3 < 8) {
    iVar4 = iVar3;
  }
  memcpy(local_68,fhobname,(long)iVar4);
  local_68[0xb] = (byte)iVar1;
  local_68[0xc] = (byte)((uint)iVar1 >> 8);
  local_68[9] = local_68[0xb];
  local_68[10] = local_68[0xc];
  if (local_68[8] != 'B') {
    local_68[9] = (char)start;
    local_68[10] = (char)((uint)start >> 8);
  }
  local_68[0xd] = 0;
  bVar2 = (local_68[0xc] + '\x01') - (local_68[0xb] == '\0');
  local_68[0xe] = bVar2;
  iVar3 = 0;
  for (lVar7 = 0; lVar7 != 0xf; lVar7 = lVar7 + 1) {
    iVar3 = (int)lVar7 + iVar3 + (uint)local_68[lVar7] * 0x101;
  }
  local_59 = (undefined2)iVar3;
  __s = (FILE *)SJ_fopen(fname,"wb");
  if (__s == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_48,fname);
    Error("opening file for write",local_48._M_dataplus._M_p,FATAL);
    std::__cxx11::string::~string((string *)&local_48);
  }
  sVar5 = fwrite(local_68,1,0x11,__s);
  uVar8 = 0;
  if (sVar5 == 0x11) {
    iVar3 = SaveRAM((FILE *)__s,start,(uint)bVar2 << 8);
    uVar8 = (uint)(iVar3 != 0);
  }
  fclose(__s);
  return uVar8;
}

Assistant:

int SaveHobeta(const std::filesystem::path & fname, const char* fhobname, aint start, aint length) {
	unsigned char header[0x11];
	int i;

	if (length + start > 0x10000) {
		length = -1;
	}
	if (length <= 0) {
		length = 0x10000 - start;
	}

	memset(header,' ',9);
	i = strlen(fhobname);
	if (i > 1)
	{
		const char *ext = strrchr(fhobname, '.');
		if (ext && ext[1])
		{
			header[8] = ext[1];
			i = ext-fhobname;
		}
	}
	memcpy(header, fhobname, std::min(i,8));

	if (header[8] == 'B')	{
		header[0x09] = (unsigned char)(length & 0xff);
		header[0x0a] = (unsigned char)(length >> 8);
	} else	{
		header[0x09] = (unsigned char)(start & 0xff);
		header[0x0a] = (unsigned char)(start >> 8);
	}

	header[0x0b] = (unsigned char)(length & 0xff);
	header[0x0c] = (unsigned char)(length >> 8);
	header[0x0d] = 0;
	if (header[0x0b] == 0) {
		header[0x0e] = header[0x0c];
	} else {
		header[0x0e] = header[0x0c] + 1;
	}
	length = header[0x0e] * 0x100;
	int chk = 0;
	for (i = 0; i <= 14; chk = chk + (header[i] * 257) + i,i++) {
		;
	}
	header[0x0f] = (unsigned char)(chk & 0xff);
	header[0x10] = (unsigned char)(chk >> 8);

	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) {
		Error("opening file for write", fname.string().c_str(), FATAL);
	}

	int result = (17 == fwrite(header, 1, 17, ff)) && SaveRAM(ff, start, length);
	fclose(ff);
	return result;
}